

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O2

REF_STATUS ref_oct_export_node(REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_GRID ref_grid)

{
  REF_INT *pRVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  REF_INT id;
  int iVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  undefined8 local_f8;
  int iStack_f0;
  int local_ec;
  ulong local_e8;
  double local_e0;
  double local_d8;
  undefined8 uStack_d0;
  REF_DBL *local_c0;
  REF_DBL diag;
  long local_b0;
  REF_DBL box [6];
  
  iVar13 = node * 0x1b;
  pRVar1 = ref_oct->nodes;
  local_c0 = bbox;
  if (ref_oct->children[node * 8] != -1) {
    lVar7 = 0;
    while (lVar7 != 0x1b) {
      lVar8 = iVar13 + lVar7;
      lVar7 = lVar7 + 1;
      if ((long)pRVar1[lVar8] != -1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x406
               ,"ref_oct_export_node","interor node with grid node",0xffffffffffffffff,
               (long)pRVar1[lVar8]);
        return 1;
      }
    }
    lVar7 = 0;
    while( true ) {
      if (lVar7 == 8) {
        return 0;
      }
      RVar3 = ref_oct_child_bbox(local_c0,(REF_INT)lVar7,box);
      if (RVar3 != 0) break;
      uVar4 = ref_oct_export_node(ref_oct,ref_oct->children[node * 8 + lVar7],box,ref_grid);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x40d
               ,"ref_oct_export_node",(ulong)uVar4,"recurse");
        return uVar4;
      }
      lVar7 = lVar7 + 1;
    }
    pcVar12 = "bbox";
    uVar10 = 1;
    uVar9 = 0x409;
    goto LAB_00173822;
  }
  if (pRVar1[(long)iVar13 + 0x1a] != -1) {
    lVar7 = 0;
    do {
      if (lVar7 == 8) {
        ref_oct_bbox_diag(bbox,&diag);
        lVar7 = 0;
        local_e8 = 0;
LAB_00172f9f:
        do {
          local_e0 = diag * 0.1;
          lVar8 = lVar7;
LAB_00172faf:
          lVar7 = lVar8 + 1;
          if (lVar7 == 7) {
            return 0;
          }
          local_d8 = local_c0[lVar8] - ref_oct->bbox[lVar8];
          uStack_d0 = 0;
          RVar3 = ref_oct_he2_qu2((REF_INT)lVar8,(REF_INT *)box);
          if (RVar3 != 0) {
            uVar10 = 1;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   0x396,"ref_oct_export_steiner",1,"qu2");
            goto LAB_00173801;
          }
          if (local_d8 <= -local_d8) {
            local_d8 = -local_d8;
          }
          id = (REF_INT)lVar7;
          if (ref_oct->nodes[box[4]._0_4_ + iVar13] == -1) {
            uVar4 = ref_oct_export_prism(ref_oct,node,ref_grid,(REF_INT *)box);
            if (uVar4 != 0) {
              pcVar12 = "whole quad pyr";
              uVar9 = 0x39a;
              goto LAB_001737f7;
            }
            if (local_d8 < local_e0) goto code_r0x0017304e;
            goto LAB_00172f9f;
          }
          bVar14 = true;
          for (lVar8 = 0; lVar8 != 9; lVar8 = lVar8 + 1) {
            if (bVar14) {
              bVar14 = ref_oct->nodes[(long)*(int *)((long)box + lVar8 * 4) + (long)iVar13] != -1;
            }
            else {
              bVar14 = false;
            }
          }
          if (!bVar14) {
            lVar8 = 0;
            while( true ) {
              if (lVar8 == 4) {
                iVar6 = 7;
                goto LAB_0017362a;
              }
              uVar4 = (int)lVar8 + 1;
              if (lVar8 == 3) {
                uVar4 = 0;
              }
              local_f8._0_4_ = *(REF_INT *)((long)box + lVar8 * 4);
              local_f8._4_4_ = *(int *)((long)box + lVar8 * 4 + 0x10);
              local_b0 = lVar8;
              if (ref_oct->nodes[local_f8._4_4_ + iVar13] != -1) break;
              local_f8._4_4_ = *(int *)((long)box + (ulong)uVar4 * 4);
              iStack_f0 = box[4]._0_4_;
              uVar4 = ref_oct_export_tet(ref_oct,node,ref_grid,(REF_INT *)&local_f8);
              if (uVar4 != 0) {
                uVar10 = (ulong)uVar4;
                uVar9 = 0x3da;
                uVar11 = (ulong)uVar4;
                pcVar12 = "tri 01";
                goto LAB_001734bf;
              }
              if ((local_d8 < local_e0) &&
                 (uVar4 = ref_oct_export_tri(ref_oct,node,ref_grid,(REF_INT *)&local_f8,id),
                 uVar4 != 0)) {
                uVar9 = 0x3de;
LAB_00173504:
                uVar10 = (ulong)uVar4;
                pcVar12 = "boundary tri";
                goto LAB_00173611;
              }
LAB_001732a0:
              lVar8 = local_b0 + 1;
            }
            iStack_f0 = box[4]._0_4_;
            uVar5 = ref_oct_export_tet(ref_oct,node,ref_grid,(REF_INT *)&local_f8);
            if (uVar5 == 0) {
              if ((local_e0 <= local_d8) ||
                 (uVar5 = ref_oct_export_tri(ref_oct,node,ref_grid,(REF_INT *)&local_f8,id),
                 uVar5 == 0)) {
                local_f8._0_4_ = *(REF_INT *)((long)box + local_b0 * 4 + 0x10);
                local_f8._4_4_ = *(int *)((long)box + (ulong)uVar4 * 4);
                iStack_f0 = box[4]._0_4_;
                uVar4 = ref_oct_export_tet(ref_oct,node,ref_grid,(REF_INT *)&local_f8);
                if (uVar4 == 0) {
                  if ((local_d8 < local_e0) &&
                     (uVar4 = ref_oct_export_tri(ref_oct,node,ref_grid,(REF_INT *)&local_f8,id),
                     uVar4 != 0)) {
                    uVar9 = 0x3ef;
                    goto LAB_00173504;
                  }
                  goto LAB_001732a0;
                }
                uVar10 = (ulong)uVar4;
                uVar9 = 0x3eb;
                uVar11 = (ulong)uVar4;
                pcVar12 = "tri m1";
              }
              else {
                uVar10 = (ulong)uVar5;
                uVar9 = 999;
                uVar11 = (ulong)uVar5;
                pcVar12 = "boundary tri";
              }
            }
            else {
              uVar10 = (ulong)uVar5;
              uVar9 = 0x3e3;
              uVar11 = (ulong)uVar5;
              pcVar12 = "tri 0m";
            }
LAB_001734bf:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   uVar9,"ref_oct_export_steiner",uVar11,pcVar12);
            iVar6 = 1;
            local_e8 = uVar10;
            goto LAB_0017362a;
          }
          local_f8._0_4_ = box[0]._0_4_;
          local_f8._4_4_ = box[2]._0_4_;
          iStack_f0 = box[4]._0_4_;
          local_ec = box[3]._4_4_;
          uVar4 = ref_oct_export_prism(ref_oct,node,ref_grid,(REF_INT *)&local_f8);
          if (uVar4 == 0) {
            if ((local_d8 < local_e0) &&
               (uVar4 = ref_oct_export_qua(ref_oct,node,ref_grid,(REF_INT *)&local_f8,id),
               uVar4 != 0)) {
              uVar10 = (ulong)uVar4;
              uVar9 = 0x3af;
LAB_00173600:
              pcVar12 = "whole quad boundary qua";
              goto LAB_00173611;
            }
            local_f8._0_4_ = box[0]._4_4_;
            local_f8._4_4_ = box[2]._4_4_;
            iStack_f0 = box[4]._0_4_;
            local_ec = box[2]._0_4_;
            uVar4 = ref_oct_export_prism(ref_oct,node,ref_grid,(REF_INT *)&local_f8);
            if (uVar4 != 0) {
              uVar9 = 0x3b4;
              uVar10 = (ulong)uVar4;
              pcVar12 = "qua 1/4";
              goto LAB_00173611;
            }
            if ((local_d8 < local_e0) &&
               (uVar4 = ref_oct_export_qua(ref_oct,node,ref_grid,(REF_INT *)&local_f8,id),
               uVar4 != 0)) {
              uVar10 = (ulong)uVar4;
              uVar9 = 0x3b8;
              goto LAB_00173600;
            }
            local_f8._0_4_ = box[1]._0_4_;
            local_f8._4_4_ = box[3]._0_4_;
            iStack_f0 = box[4]._0_4_;
            local_ec = box[2]._4_4_;
            uVar4 = ref_oct_export_prism(ref_oct,node,ref_grid,(REF_INT *)&local_f8);
            if (uVar4 != 0) {
              uVar9 = 0x3bd;
              uVar10 = (ulong)uVar4;
              pcVar12 = "qua 2/4";
              goto LAB_00173611;
            }
            if ((local_d8 < local_e0) &&
               (uVar4 = ref_oct_export_qua(ref_oct,node,ref_grid,(REF_INT *)&local_f8,id),
               uVar4 != 0)) {
              uVar10 = (ulong)uVar4;
              uVar9 = 0x3c1;
              goto LAB_00173600;
            }
            local_f8._0_4_ = box[1]._4_4_;
            local_f8._4_4_ = box[3]._4_4_;
            iStack_f0 = box[4]._0_4_;
            local_ec = box[3]._0_4_;
            uVar4 = ref_oct_export_prism(ref_oct,node,ref_grid,(REF_INT *)&local_f8);
            if (uVar4 != 0) {
              uVar9 = 0x3c6;
              uVar10 = (ulong)uVar4;
              pcVar12 = "qua 3/4";
              goto LAB_00173611;
            }
            if (local_d8 < local_e0) {
              uVar4 = ref_oct_export_qua(ref_oct,node,ref_grid,(REF_INT *)&local_f8,id);
              uVar10 = (ulong)uVar4;
              iVar6 = 7;
              if (uVar4 != 0) {
                uVar9 = 0x3ca;
                goto LAB_00173600;
              }
            }
            else {
              iVar6 = 7;
            }
          }
          else {
            uVar9 = 0x3ab;
            uVar10 = (ulong)uVar4;
            pcVar12 = "qua 0/4";
LAB_00173611:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   uVar9,"ref_oct_export_steiner",uVar10,pcVar12);
            iVar6 = 1;
            local_e8 = uVar10;
          }
LAB_0017362a:
          if (iVar6 != 7) {
            uVar10 = local_e8;
            if ((int)local_e8 == 0) {
              return 0;
            }
            goto LAB_00173801;
          }
        } while( true );
      }
      lVar8 = iVar13 + lVar7;
      lVar7 = lVar7 + 1;
    } while (pRVar1[lVar8] != -1);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x38e,
           "ref_oct_export_steiner","expects to be set");
    uVar10 = 1;
LAB_00173801:
    pcVar12 = "whole";
    uVar9 = 0x3ff;
    goto LAB_00173822;
  }
  lVar7 = 0;
  do {
    if (lVar7 == 8) {
      lVar7 = 8;
      goto LAB_001736a5;
    }
    lVar8 = iVar13 + lVar7;
    lVar7 = lVar7 + 1;
  } while (pRVar1[lVar8] != -1);
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x336,
         "ref_oct_export_whole","expects to be set");
  goto LAB_001736f3;
code_r0x0017304e:
  uVar4 = ref_oct_export_qua(ref_oct,node,ref_grid,(REF_INT *)box,id);
  lVar8 = lVar7;
  if (uVar4 != 0) {
    pcVar12 = "whole quad boundary qua";
    uVar9 = 0x39e;
LAB_001737f7:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar9,
           "ref_oct_export_steiner",(ulong)uVar4,pcVar12);
    uVar10 = (ulong)uVar4;
    goto LAB_00173801;
  }
  goto LAB_00172faf;
LAB_001736a5:
  if (lVar7 != 0x1b) goto code_r0x001736ab;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    *(REF_INT *)((long)box + lVar7 * 4) = pRVar1[iVar13 + lVar7];
  }
  uVar4 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)box,(REF_INT *)&diag);
  if (uVar4 == 0) {
    ref_cell = ref_grid->cell[6];
    ref_oct_bbox_diag(local_c0,(REF_DBL *)&local_f8);
    local_d8 = (double)CONCAT44(local_f8._4_4_,(REF_INT)local_f8) * 0.1;
    lVar7 = 0;
    dVar16 = local_d8;
    do {
      while( true ) {
        if (lVar7 == 6) {
          return 0;
        }
        dVar15 = local_c0[lVar7] - ref_oct->bbox[lVar7];
        if (dVar15 <= -dVar15) {
          dVar15 = -dVar15;
        }
        if (dVar15 < dVar16) break;
        lVar7 = lVar7 + 1;
      }
      pRVar1 = ref_oct->nodes;
      pRVar2 = ref_grid->cell[0xb]->f2n;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        iVar6 = pRVar2[lVar7 * 4 + lVar8];
        *(int *)((long)box + lVar8 * 4) = iVar6;
        *(REF_INT *)((long)box + lVar8 * 4) = pRVar1[iVar6 + iVar13];
      }
      lVar7 = lVar7 + 1;
      *(int *)((long)box + (long)ref_cell->node_per * 4) = (int)lVar7;
      uVar4 = ref_cell_add(ref_cell,(REF_INT *)box,(REF_INT *)&diag);
      dVar16 = local_d8;
    } while (uVar4 == 0);
    pcVar12 = "add quad";
    uVar9 = 0x348;
  }
  else {
    pcVar12 = "add hex";
    uVar9 = 0x33c;
  }
  uVar10 = (ulong)uVar4;
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar9,
         "ref_oct_export_whole",uVar10,pcVar12);
  goto LAB_00173759;
code_r0x001736ab:
  lVar8 = iVar13 + lVar7;
  lVar7 = lVar7 + 1;
  if ((long)pRVar1[lVar8] != -1) goto code_r0x001736b8;
  goto LAB_001736a5;
code_r0x001736b8:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x339,
         "ref_oct_export_whole","implement 2-1",0xffffffffffffffff,(long)pRVar1[lVar8]);
  ref_oct_tattle(ref_oct,node);
LAB_001736f3:
  uVar10 = 1;
LAB_00173759:
  pcVar12 = "whole";
  uVar9 = 0x3fd;
LAB_00173822:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar9,
         "ref_oct_export_node",uVar10 & 0xffffffff,pcVar12);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_export_node(REF_OCT ref_oct, REF_INT node,
                                              REF_DBL *bbox,
                                              REF_GRID ref_grid) {
  if (ref_oct_leaf_node(ref_oct, node)) {
    if (REF_EMPTY == ref_oct_c2n(ref_oct, 26, node)) {
      RSS(ref_oct_export_whole(ref_oct, node, bbox, ref_grid), "whole");
    } else {
      RSS(ref_oct_export_steiner(ref_oct, node, bbox, ref_grid), "whole");
    }
  } else {
    REF_INT i;
    REF_INT child_index;
    for (i = 0; i < 27; i++)
      REIS(REF_EMPTY, ref_oct_c2n(ref_oct, i, node),
           "interor node with grid node");
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RSS(ref_oct_export_node(ref_oct,
                              ref_oct_child(ref_oct, child_index, node), box,
                              ref_grid),
          "recurse");
    }
  }
  return REF_SUCCESS;
}